

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_20f37ae::EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test::TestBody
          (EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test *this)

{
  uint8_t *puVar1;
  int16_t *scan;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  aom_usec_timer timer_ref;
  aom_usec_timer timer;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  puts("Note: Only test the largest possible eob case!");
  puVar1 = (this->super_EncodeTxbTest).levels_buf_;
  lVar8 = 0;
  do {
    uVar3 = (uint)lVar8 & 0xff;
    lVar2 = 10;
    iVar10 = 0x20;
    uVar9 = (uint)lVar8 & 0xff;
    if (uVar3 < 0x11) {
      lVar4 = 3;
      if ((1 < uVar3 - 0xb) && (uVar3 != 4)) {
LAB_0071b255:
        lVar4 = lVar8;
      }
      iVar7 = tx_size_high_log2[lVar4];
      if (uVar9 < 0x11) {
        lVar4 = 3;
        if ((1 < uVar9 - 0xb) && (uVar9 != 4)) {
          lVar4 = lVar8;
        }
      }
      else {
        if (uVar9 == 0x11) goto LAB_0071b2b8;
        lVar4 = lVar8;
        if (uVar9 == 0x12) goto LAB_0071b2db;
      }
      iVar10 = ::tx_size_wide[lVar4];
      if (uVar9 < 0x11) {
        lVar2 = 3;
        if ((1 < uVar9 - 0xb) && (uVar9 != 4)) {
LAB_0071b2d1:
          lVar2 = lVar8;
        }
      }
      else if (uVar9 == 0x11) {
        lVar2 = 9;
      }
      else if (uVar9 != 0x12) goto LAB_0071b2d1;
    }
    else {
      iVar7 = 5;
      if (uVar3 == 0x11) {
LAB_0071b2b8:
        lVar2 = 9;
        iVar10 = 0x10;
      }
      else {
        iVar7 = 4;
        if (uVar3 != 0x12) goto LAB_0071b255;
      }
    }
LAB_0071b2db:
    uVar3 = ::tx_size_wide[lVar8];
    uVar9 = ::tx_size_high[lVar8];
    scan = av1_scan_orders[lVar8][0].scan;
    iVar10 = iVar10 * ::tx_size_high[lVar2];
    uVar11 = 2000000000 / (long)iVar10 & 0xffffffff;
    (this->super_EncodeTxbTest).levels_ = puVar1;
    EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar7,iVar10);
    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
    uVar6 = uVar11;
    if ((int)(2000000000 / (long)iVar10) < 1) {
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      (this->super_EncodeTxbTest).levels_ = puVar1;
      EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar7,iVar10);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    }
    else {
      do {
        av1_get_nz_map_contexts_c
                  ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar10,(TX_SIZE)lVar8,'\0',
                   (this->super_EncodeTxbTest).coeff_contexts_ref_);
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != 0);
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      (this->super_EncodeTxbTest).levels_ = puVar1;
      EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar7,iVar10);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      do {
        (*(this->super_EncodeTxbTest).get_nz_map_contexts_func_)
                  ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar10,(TX_SIZE)lVar8,'\0',
                   (this->super_EncodeTxbTest).coeff_contexts_);
        uVar5 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar5;
      } while (uVar5 != 0);
    }
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    lVar2 = local_60.tv_usec - local_70.tv_usec;
    iVar10 = (int)lVar2 + 1000000;
    if (-1 < lVar2) {
      iVar10 = (int)lVar2;
    }
    lVar4 = local_40.tv_usec - local_50.tv_usec;
    iVar7 = (int)lVar4 + 1000000;
    if (-1 < lVar4) {
      iVar7 = (int)lVar4;
    }
    dVar12 = (double)(iVar7 + ((int)(lVar4 >> 0x3f) + ((int)local_40.tv_sec - (int)local_50.tv_sec))
                              * 1000000);
    dVar13 = (double)(iVar10 + ((int)(lVar2 >> 0x3f) + ((int)local_60.tv_sec - (int)local_70.tv_sec)
                               ) * 1000000);
    printf("get_nz_map_contexts_%2dx%2d: %7.1f ms ref %7.1f ms gain %4.2f\n",dVar12 / 1000.0,
           dVar13 / 1000.0,dVar13 / dVar12,(ulong)uVar3,(ulong)uVar9);
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x13) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(EncodeTxbTest, DISABLED_SpeedTestGetNzMapContexts) {
  SpeedTestGetNzMapContextsRun();
}